

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O3

void __thiscall Assimp::AC3DImporter::AC3DImporter(AC3DImporter *this)

{
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_008c93e0;
  this->buffer = (char *)0x0;
  this->configSplitBFCull = false;
  this->configEvalSubdivision = false;
  *(undefined8 *)&this->mNumMeshes = 0;
  *(undefined8 *)((long)&this->mLights + 4) = 0;
  this->lights = 0;
  this->groups = 0;
  this->polys = 0;
  this->worlds = 0;
  return;
}

Assistant:

AC3DImporter::AC3DImporter()
    : buffer(),
    configSplitBFCull(),
    configEvalSubdivision(),
    mNumMeshes(),
    mLights(),
    lights(),
    groups(),
    polys(),
    worlds()
{
    // nothing to be done here
}